

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_converter.h
# Opt level: O2

bool date::date_converter<date::rfc1123,_long,_void>::to_parts(time_t timepoint,parts *parts)

{
  week_day wVar1;
  seconds_count sVar2;
  date_time dVar3;
  date_time dt;
  date_time local_20;
  
  local_20.super_date.year = 0x7b2;
  local_20.super_date.month = '\x01';
  local_20.super_date.day = '\x01';
  local_20.super_time.hour = '\0';
  local_20.super_time.minute = '\0';
  local_20.super_time.second = '\0';
  sVar2 = calendar_helper::to_seconds_count(&local_20);
  dVar3 = calendar_helper::from_seconds_count(timepoint + sVar2);
  local_20.super_date.year = dVar3.super_date.year;
  local_20.super_date._2_2_ = dVar3.super_date._2_2_;
  local_20.super_time.second = dVar3.super_time.second;
  local_20.super_time.hour = dVar3.super_time.hour;
  local_20.super_time.minute = dVar3.super_time.minute;
  parts->year = local_20.super_date.year;
  parts->month = dVar3.super_date.month;
  parts->day = dVar3.super_date.day;
  wVar1 = calendar_helper::day_of_week(&local_20.super_date);
  parts->week_day = wVar1;
  parts->hour = local_20.super_time.hour;
  parts->minute = local_20.super_time.minute;
  parts->second = local_20.super_time.second;
  parts->offset_in_minutes = 0;
  return true;
}

Assistant:

static bool to_parts(std::time_t timepoint, rfc1123::parts& parts)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto dt = calendar_helper::from_seconds_count(epoch_offset + timepoint);
        parts.year     = dt.year;
        parts.month    = dt.month;
        parts.day      = dt.day;
        parts.week_day = calendar_helper::day_of_week(dt);
        parts.hour     = dt.hour;
        parts.minute   = dt.minute;
        parts.second   = dt.second;
        parts.offset_in_minutes = 0;
        return true;
    }